

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O0

ConstIterator __thiscall
axl::sl::
HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
::find(HashTable<char,_axl::sl::SwitchInfo_*,_axl::sl::HashId<char>,_axl::sl::Eq<char,_char>,_char,_axl::sl::SwitchInfo_*>
       *this,char key)

{
  bool bVar1;
  void *pvVar2;
  HashTableEntry<char,_axl::sl::SwitchInfo_*> *pHVar3;
  char in_SIL;
  ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  *in_RDI;
  bool isEqual;
  ConstIterator it;
  size_t hash;
  size_t bucketCount;
  HashTableEntry<char,_axl::sl::SwitchInfo_*> *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  char in_stack_ffffffffffffffb7;
  IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  in_stack_ffffffffffffffc0;
  IteratorImpl<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
  local_30;
  size_t local_28;
  size_t local_20;
  char local_11;
  IteratorImpl<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
  local_8;
  
  local_11 = in_SIL;
  local_20 = ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
             ::getCount((ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                         *)(in_RDI + 3));
  if (local_20 == 0) {
    ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
    ::ConstIterator((ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                     *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8);
  }
  else {
    local_28 = HashId<char>::operator()((HashId<char> *)(in_RDI + 7),local_11);
    Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
    ::operator[]((Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                 (intptr_t)in_stack_ffffffffffffffa8);
    local_30.
    super_IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
    .m_p = (IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
            )ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
             ::getHead((ListBase<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
                        *)in_stack_ffffffffffffffa8);
    while (pvVar2 = sl::IteratorBase::operator_cast_to_void_((IteratorBase *)&local_30),
          pvVar2 != (void *)0x0) {
      in_stack_ffffffffffffffa8 =
           (HashTableEntry<char,_axl::sl::SwitchInfo_*> *)
           ((long)&in_RDI[7].
                   super_IteratorImpl<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
                   .
                   super_IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
                   .m_p + 1);
      in_stack_ffffffffffffffb7 = local_11;
      pHVar3 = IteratorImpl<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
               ::operator->(&local_30);
      bVar1 = Eq<char,_char>::operator()
                        ((Eq<char,_char> *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb7,
                         (pHVar3->super_MapEntry<char,_axl::sl::SwitchInfo_*>).m_key);
      if (bVar1) {
        ConstIterator<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::ListLink>>
        ::
        ConstIterator<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>
                  ((ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                    *)in_stack_ffffffffffffffc0.m_p,in_RDI);
        return (ConstIterator)
               local_8.
               super_IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
               .m_p;
      }
      in_stack_ffffffffffffffc0.m_p =
           (Entry *)IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
                    ::operator++((IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>
                                  *)in_stack_ffffffffffffffa8,0);
    }
    ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
    ::ConstIterator((ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
                     *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8);
  }
  return (ConstIterator)
         local_8.
         super_IteratorBase<axl::sl::ConstIterator<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>,_const_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_const_axl::sl::ListLink,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::ListLink>_>
         .m_p;
}

Assistant:

ConstIterator
	find(KeyArg key) const {
		size_t bucketCount = m_table.getCount();
		if (!bucketCount)
			return NULL;

		size_t hash = m_hash(key);
		typename Bucket::ConstIterator it = m_table[hash % bucketCount].getHead();
		for (; it; it++) {
			bool isEqual = m_eq(key, it->m_key);
			if (isEqual)
				return it;
		}

		return NULL;
	}